

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O0

void __thiscall
Eigen::RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::computeShift
          (RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this,Index iu,Index iter,
          Scalar *exshift,Vector3s *shiftInfo)

{
  Scalar SVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  double *in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int __x;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar4;
  Index i_1;
  Scalar s_1;
  Scalar s;
  Index i;
  Index in_stack_ffffffffffffff18;
  PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffff20;
  double dVar5;
  Index in_stack_ffffffffffffff30;
  Index in_stack_ffffffffffffff38;
  Scalar *val;
  PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *in_stack_ffffffffffffff40;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_30;
  
  pSVar2 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30)
  ;
  SVar1 = *pSVar2;
  pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeffRef
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  *pSVar3 = SVar1;
  pSVar2 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30)
  ;
  SVar1 = *pSVar2;
  pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeffRef
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  *pSVar3 = SVar1;
  pSVar2 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30)
  ;
  dVar4 = *pSVar2;
  pSVar2 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30)
  ;
  dVar5 = *pSVar2;
  pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeffRef
                     (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  *pSVar3 = dVar4 * dVar5;
  if (in_RDX == 10) {
    pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeff
                       (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    *in_RCX = *pSVar3 + *in_RCX;
    for (local_30 = 0; local_30 <= in_RSI; local_30 = local_30 + 1) {
      pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeff
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      dVar4 = *pSVar3;
      pSVar2 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                         (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                          in_stack_ffffffffffffff30);
      *pSVar2 = *pSVar2 - dVar4;
    }
    __x = in_EDI;
    PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::abs(__x);
    PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeff
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    std::abs(in_EDI);
    dVar4 = extraout_XMM0_Qa + extraout_XMM0_Qa_00;
    pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeffRef
                       (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    *pSVar3 = dVar4 * 0.75;
    pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeffRef
                       (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    *pSVar3 = dVar4 * 0.75;
    pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeffRef
                       (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    *pSVar3 = dVar4 * -0.4375 * dVar4;
  }
  if (in_RDX == 0x1e) {
    pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeff
                       (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    dVar4 = *pSVar3;
    pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeff
                       (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    dVar4 = (dVar4 - *pSVar3) / 2.0;
    pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeff
                       (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    dVar4 = dVar4 * dVar4 + *pSVar3;
    if (0.0 < dVar4) {
      local_40 = sqrt(dVar4);
      pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeff
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      this_00 = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)*pSVar3;
      pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeff
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      if ((double)this_00 < *pSVar3) {
        local_40 = -local_40;
      }
      pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeff
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      dVar4 = *pSVar3;
      pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeff
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      dVar4 = local_40 + (dVar4 - *pSVar3) / 2.0;
      pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeff
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      val = (Scalar *)*pSVar3;
      pSVar3 = PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::coeff
                         (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      dVar4 = (double)val - *pSVar3 / dVar4;
      *in_RCX = dVar4 + *in_RCX;
      for (local_48 = 0; local_48 <= in_RSI; local_48 = local_48 + 1) {
        dVar5 = dVar4;
        pSVar2 = PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::coeffRef
                           ((PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)this_00,
                            (Index)val,(Index)local_40);
        *pSVar2 = *pSVar2 - dVar5;
      }
      DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::setConstant(this_00,val);
    }
  }
  return;
}

Assistant:

inline void RealSchur<MatrixType>::computeShift(Index iu, Index iter, Scalar& exshift, Vector3s& shiftInfo)
{
  using std::sqrt;
  using std::abs;
  shiftInfo.coeffRef(0) = m_matT.coeff(iu,iu);
  shiftInfo.coeffRef(1) = m_matT.coeff(iu-1,iu-1);
  shiftInfo.coeffRef(2) = m_matT.coeff(iu,iu-1) * m_matT.coeff(iu-1,iu);

  // Wilkinson's original ad hoc shift
  if (iter == 10)
  {
    exshift += shiftInfo.coeff(0);
    for (Index i = 0; i <= iu; ++i)
      m_matT.coeffRef(i,i) -= shiftInfo.coeff(0);
    Scalar s = abs(m_matT.coeff(iu,iu-1)) + abs(m_matT.coeff(iu-1,iu-2));
    shiftInfo.coeffRef(0) = Scalar(0.75) * s;
    shiftInfo.coeffRef(1) = Scalar(0.75) * s;
    shiftInfo.coeffRef(2) = Scalar(-0.4375) * s * s;
  }

  // MATLAB's new ad hoc shift
  if (iter == 30)
  {
    Scalar s = (shiftInfo.coeff(1) - shiftInfo.coeff(0)) / Scalar(2.0);
    s = s * s + shiftInfo.coeff(2);
    if (s > Scalar(0))
    {
      s = sqrt(s);
      if (shiftInfo.coeff(1) < shiftInfo.coeff(0))
        s = -s;
      s = s + (shiftInfo.coeff(1) - shiftInfo.coeff(0)) / Scalar(2.0);
      s = shiftInfo.coeff(0) - shiftInfo.coeff(2) / s;
      exshift += s;
      for (Index i = 0; i <= iu; ++i)
        m_matT.coeffRef(i,i) -= s;
      shiftInfo.setConstant(Scalar(0.964));
    }
  }
}